

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-stdio-over-pipes.c
# Opt level: O3

void on_pipe_read(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  char *__s2;
  int iVar1;
  
  if (nread < 1) {
    on_pipe_read_cold_1();
  }
  else {
    __s2 = buf->base;
    iVar1 = bcmp("hello world\n",__s2,nread);
    if (iVar1 == 0) {
      on_pipe_read_called = on_pipe_read_called + 1;
      free(__s2);
      uv_close((uv_handle_t *)&stdin_pipe,close_cb);
      uv_close((uv_handle_t *)&stdout_pipe,close_cb);
      return;
    }
  }
  on_pipe_read_cold_2();
  close_cb_called = close_cb_called + 1;
  return;
}

Assistant:

static void on_pipe_read(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* buf) {
  ASSERT(nread > 0);
  ASSERT(memcmp("hello world\n", buf->base, nread) == 0);
  on_pipe_read_called++;

  free(buf->base);

  uv_close((uv_handle_t*)&stdin_pipe, close_cb);
  uv_close((uv_handle_t*)&stdout_pipe, close_cb);
}